

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkPulley.cpp
# Opt level: O2

Vector * __thiscall
chrono::ChLinkPulley::Get_shaft_dir1(Vector *__return_storage_ptr__,ChLinkPulley *this)

{
  ChVector<double> *Z;
  double dVar1;
  undefined1 auVar2 [16];
  ChFrame<double> absframe;
  ChVector<double> local_d8;
  ChQuaternion<double> local_c0;
  undefined1 local_a0 [104];
  double local_38;
  double local_20;
  
  auVar2 = _VECT_Z;
  dVar1 = DAT_011dd430;
  if ((this->super_ChLinkLockLock).super_ChLinkLock.super_ChLinkMarkers.super_ChLink.Body1 !=
      (ChBodyFrame *)0x0) {
    local_d8.m_data[2] = 0.0;
    local_c0.m_data[0] = 1.0;
    local_c0.m_data[3] = 0.0;
    local_d8.m_data[0] = 0.0;
    local_d8.m_data[1] = 0.0;
    local_c0.m_data[1] = 0.0;
    local_c0.m_data[2] = 0.0;
    ChFrame<double>::ChFrame((ChFrame<double> *)local_a0,&local_d8,&local_c0);
    ChFrame<double>::TransformLocalToParent
              ((ChFrame<double> *)
               (this->super_ChLinkLockLock).super_ChLinkLock.super_ChLinkMarkers.super_ChLink.Body1,
               &this->local_shaft1,(ChFrame<double> *)local_a0);
    auVar2 = vmovhps_avx(local_a0._80_16_,local_38);
    dVar1 = local_20;
  }
  *(undefined1 (*) [16])__return_storage_ptr__->m_data = auVar2;
  __return_storage_ptr__->m_data[2] = dVar1;
  return __return_storage_ptr__;
}

Assistant:

Vector ChLinkPulley::Get_shaft_dir1() {
    if (Body1) {
        ChFrame<double> absframe;
        ((ChFrame<double>*)Body1)->TransformLocalToParent(local_shaft1, absframe);
        return absframe.GetA().Get_A_Zaxis();
    } else
        return VECT_Z;
}